

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O0

ngx_int_t ngx_cmp_sockaddr(sockaddr *sa1,socklen_t slen1,sockaddr *sa2,socklen_t slen2,
                          ngx_uint_t cmp_port)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  int iVar7;
  ulong uVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  sockaddr_un *saun2;
  sockaddr_un *saun1;
  size_t len;
  sockaddr_in6 *sin62;
  sockaddr_in6 *sin61;
  sockaddr_in *sin2;
  sockaddr_in *sin1;
  ngx_uint_t cmp_port_local;
  socklen_t slen2_local;
  sockaddr *sa2_local;
  socklen_t slen1_local;
  sockaddr *sa1_local;
  
  if (sa1->sa_family != sa2->sa_family) {
    return -5;
  }
  if (sa1->sa_family == 1) {
    if (slen1 < slen2) {
      uVar8 = (ulong)slen1;
    }
    else {
      uVar8 = (ulong)slen2;
    }
    saun1 = (sockaddr_un *)(uVar8 - 2);
    if ((sockaddr_un *)0x6c < saun1) {
      saun1 = (sockaddr_un *)0x6c;
    }
    iVar7 = memcmp(sa1->sa_data,sa2->sa_data,(size_t)saun1);
    if (iVar7 != 0) {
      return -5;
    }
  }
  else if (sa1->sa_family == 10) {
    if ((cmp_port != 0) && (*(short *)sa1->sa_data != *(short *)sa2->sa_data)) {
      return -5;
    }
    cVar9 = -(sa1->sa_data[6] == sa2->sa_data[6]);
    cVar10 = -(sa1->sa_data[7] == sa2->sa_data[7]);
    cVar11 = -(sa1->sa_data[8] == sa2->sa_data[8]);
    cVar12 = -(sa1->sa_data[9] == sa2->sa_data[9]);
    cVar13 = -(sa1->sa_data[10] == sa2->sa_data[10]);
    cVar14 = -(sa1->sa_data[0xb] == sa2->sa_data[0xb]);
    cVar15 = -(sa1->sa_data[0xc] == sa2->sa_data[0xc]);
    cVar16 = -(sa1->sa_data[0xd] == sa2->sa_data[0xd]);
    cVar17 = -((char)sa1[1].sa_family == (char)sa2[1].sa_family);
    cVar18 = -(*(char *)((long)&sa1[1].sa_family + 1) == *(char *)((long)&sa2[1].sa_family + 1));
    cVar19 = -(sa1[1].sa_data[0] == sa2[1].sa_data[0]);
    cVar20 = -(sa1[1].sa_data[1] == sa2[1].sa_data[1]);
    cVar21 = -(sa1[1].sa_data[2] == sa2[1].sa_data[2]);
    cVar22 = -(sa1[1].sa_data[3] == sa2[1].sa_data[3]);
    cVar23 = -(sa1[1].sa_data[4] == sa2[1].sa_data[4]);
    bVar24 = -(sa1[1].sa_data[5] == sa2[1].sa_data[5]);
    auVar1[1] = cVar10;
    auVar1[0] = cVar9;
    auVar1[2] = cVar11;
    auVar1[3] = cVar12;
    auVar1[4] = cVar13;
    auVar1[5] = cVar14;
    auVar1[6] = cVar15;
    auVar1[7] = cVar16;
    auVar1[8] = cVar17;
    auVar1[9] = cVar18;
    auVar1[10] = cVar19;
    auVar1[0xb] = cVar20;
    auVar1[0xc] = cVar21;
    auVar1[0xd] = cVar22;
    auVar1[0xe] = cVar23;
    auVar1[0xf] = bVar24;
    auVar2[1] = cVar10;
    auVar2[0] = cVar9;
    auVar2[2] = cVar11;
    auVar2[3] = cVar12;
    auVar2[4] = cVar13;
    auVar2[5] = cVar14;
    auVar2[6] = cVar15;
    auVar2[7] = cVar16;
    auVar2[8] = cVar17;
    auVar2[9] = cVar18;
    auVar2[10] = cVar19;
    auVar2[0xb] = cVar20;
    auVar2[0xc] = cVar21;
    auVar2[0xd] = cVar22;
    auVar2[0xe] = cVar23;
    auVar2[0xf] = bVar24;
    auVar6[1] = cVar12;
    auVar6[0] = cVar11;
    auVar6[2] = cVar13;
    auVar6[3] = cVar14;
    auVar6[4] = cVar15;
    auVar6[5] = cVar16;
    auVar6[6] = cVar17;
    auVar6[7] = cVar18;
    auVar6[8] = cVar19;
    auVar6[9] = cVar20;
    auVar6[10] = cVar21;
    auVar6[0xb] = cVar22;
    auVar6[0xc] = cVar23;
    auVar6[0xd] = bVar24;
    auVar5[1] = cVar13;
    auVar5[0] = cVar12;
    auVar5[2] = cVar14;
    auVar5[3] = cVar15;
    auVar5[4] = cVar16;
    auVar5[5] = cVar17;
    auVar5[6] = cVar18;
    auVar5[7] = cVar19;
    auVar5[8] = cVar20;
    auVar5[9] = cVar21;
    auVar5[10] = cVar22;
    auVar5[0xb] = cVar23;
    auVar5[0xc] = bVar24;
    auVar4[1] = cVar14;
    auVar4[0] = cVar13;
    auVar4[2] = cVar15;
    auVar4[3] = cVar16;
    auVar4[4] = cVar17;
    auVar4[5] = cVar18;
    auVar4[6] = cVar19;
    auVar4[7] = cVar20;
    auVar4[8] = cVar21;
    auVar4[9] = cVar22;
    auVar4[10] = cVar23;
    auVar4[0xb] = bVar24;
    auVar3[1] = cVar15;
    auVar3[0] = cVar14;
    auVar3[2] = cVar16;
    auVar3[3] = cVar17;
    auVar3[4] = cVar18;
    auVar3[5] = cVar19;
    auVar3[6] = cVar20;
    auVar3[7] = cVar21;
    auVar3[8] = cVar22;
    auVar3[9] = cVar23;
    auVar3[10] = bVar24;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar24,CONCAT18(cVar23,CONCAT17(cVar22,CONCAT16(cVar21,
                                                  CONCAT15(cVar20,CONCAT14(cVar19,CONCAT13(cVar18,
                                                  CONCAT12(cVar17,CONCAT11(cVar16,cVar15))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar24,CONCAT17(cVar23,CONCAT16(cVar22,CONCAT15(cVar21,
                                                  CONCAT14(cVar20,CONCAT13(cVar19,CONCAT12(cVar18,
                                                  CONCAT11(cVar17,cVar16)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar24 >> 7) << 0xf) != 0xffff) {
      return -5;
    }
  }
  else {
    if ((cmp_port != 0) && (*(short *)sa1->sa_data != *(short *)sa2->sa_data)) {
      return -5;
    }
    if (*(int *)(sa1->sa_data + 2) != *(int *)(sa2->sa_data + 2)) {
      return -5;
    }
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_cmp_sockaddr(struct sockaddr *sa1, socklen_t slen1,
    struct sockaddr *sa2, socklen_t slen2, ngx_uint_t cmp_port)
{
    struct sockaddr_in   *sin1, *sin2;
#if (NGX_HAVE_INET6)
    struct sockaddr_in6  *sin61, *sin62;
#endif
#if (NGX_HAVE_UNIX_DOMAIN)
    size_t                len;
    struct sockaddr_un   *saun1, *saun2;
#endif

    if (sa1->sa_family != sa2->sa_family) {
        return NGX_DECLINED;
    }

    switch (sa1->sa_family) {

#if (NGX_HAVE_INET6)
    case AF_INET6:

        sin61 = (struct sockaddr_in6 *) sa1;
        sin62 = (struct sockaddr_in6 *) sa2;

        if (cmp_port && sin61->sin6_port != sin62->sin6_port) {
            return NGX_DECLINED;
        }

        if (ngx_memcmp(&sin61->sin6_addr, &sin62->sin6_addr, 16) != 0) {
            return NGX_DECLINED;
        }

        break;
#endif

#if (NGX_HAVE_UNIX_DOMAIN)
    case AF_UNIX:

        saun1 = (struct sockaddr_un *) sa1;
        saun2 = (struct sockaddr_un *) sa2;

        if (slen1 < slen2) {
            len = slen1 - offsetof(struct sockaddr_un, sun_path);

        } else {
            len = slen2 - offsetof(struct sockaddr_un, sun_path);
        }

        if (len > sizeof(saun1->sun_path)) {
            len = sizeof(saun1->sun_path);
        }

        if (ngx_memcmp(&saun1->sun_path, &saun2->sun_path, len) != 0) {
            return NGX_DECLINED;
        }

        break;
#endif

    default: /* AF_INET */

        sin1 = (struct sockaddr_in *) sa1;
        sin2 = (struct sockaddr_in *) sa2;

        if (cmp_port && sin1->sin_port != sin2->sin_port) {
            return NGX_DECLINED;
        }

        if (sin1->sin_addr.s_addr != sin2->sin_addr.s_addr) {
            return NGX_DECLINED;
        }

        break;
    }

    return NGX_OK;
}